

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O2

int Abc_TtReadHex(word *pTruth,char *pString)

{
  char cVar1;
  int iVar2;
  ulong uVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  word wVar7;
  byte *pbVar8;
  uint uVar9;
  byte bVar10;
  ulong uVar11;
  
  if (*pString == '0') {
    pString = pString + (ulong)(pString[1] == 'x') * 2;
  }
  uVar3 = 0;
  while ((0xf5 < (byte)(pString[uVar3] - 0x3aU) || (0xf9 < (byte)((pString[uVar3] & 0xdfU) + 0xb9)))
        ) {
    uVar3 = uVar3 + 1;
  }
  iVar2 = (int)uVar3;
  if (iVar2 == 1) {
    cVar1 = *pString;
    if (cVar1 != 'F') {
      if ((cVar1 == '5') || (cVar1 == 'A')) {
        uVar3 = 0x5555555555555555;
        wVar7 = 0xaaaaaaaaaaaaaaaa;
        if (cVar1 == '5') {
          wVar7 = 0x5555555555555555;
        }
        goto LAB_005da52c;
      }
      if (cVar1 != '0') {
        uVar11 = 1;
        uVar9 = 2;
        goto LAB_005da468;
      }
    }
    wVar7 = -(ulong)(cVar1 != '0');
  }
  else {
    if (iVar2 == 0) {
      uVar6 = 0;
    }
    else {
      uVar6 = 0;
      for (uVar9 = iVar2 - 1; uVar9 != 0; uVar9 = uVar9 >> 1) {
        uVar6 = uVar6 + 1;
      }
    }
    uVar9 = uVar6 + 2;
    uVar11 = (ulong)(uint)(1 << ((char)uVar6 - 4U & 0x1f));
    if (uVar6 < 5) {
      uVar11 = 1;
    }
LAB_005da468:
    for (; 0 < (int)uVar11; uVar11 = uVar11 - 1) {
      pTruth[uVar11 - 1] = 0;
    }
    pbVar8 = (byte *)(pString + iVar2);
    bVar10 = 0;
    for (uVar11 = 0; pbVar8 = pbVar8 + -1, uVar3 != uVar11; uVar11 = uVar11 + 1) {
      bVar4 = *pbVar8;
      iVar2 = -0x30;
      if (((9 < (byte)(bVar4 - 0x30)) && (iVar2 = -0x37, 5 < (byte)(bVar4 + 0xbf))) &&
         (iVar2 = -0x57, 5 < (byte)(bVar4 + 0x9f))) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                      ,0x4bf,"int Abc_TtReadHexDigit(char)");
      }
      pTruth[uVar11 >> 4 & 0xfffffff] =
           pTruth[uVar11 >> 4 & 0xfffffff] | (ulong)(iVar2 + (uint)bVar4) << (bVar10 & 0x3c);
      bVar10 = bVar10 + 4;
    }
    if (5 < (int)uVar9) goto LAB_005da52f;
    if ((int)uVar9 < 0) {
      __assert_fail("nVars >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                    ,0x489,"word Abc_Tt6Stretch(word, int)");
    }
    bVar10 = (byte)*pTruth;
    bVar4 = (bVar10 & 0xf) * '\x11';
    if (2 < uVar9) {
      bVar4 = bVar10;
    }
    uVar5 = (uint)bVar4 * 0x101;
    uVar6 = 3;
    if (3 < uVar9) {
      uVar5 = (uint)*pTruth;
      uVar6 = uVar9;
    }
    uVar9 = (uVar5 & 0xffff) * 0x10001;
    if (1 < uVar6 - 3) {
      uVar9 = uVar5;
    }
    uVar3 = (ulong)uVar9;
    wVar7 = uVar3 * 0x100000001;
  }
LAB_005da52c:
  *pTruth = wVar7;
LAB_005da52f:
  return (int)uVar3;
}

Assistant:

static inline int Abc_TtReadHex( word * pTruth, char * pString )
{
    int k, nVars, Digit, nDigits;
    // skip the first 2 symbols if they are "0x"
    if ( pString[0] == '0' && pString[1] == 'x' )
        pString += 2;
    // count the number of hex digits
    nDigits = 0;
    for ( k = 0; Abc_TtIsHexDigit(pString[k]); k++ )
        nDigits++;
    if ( nDigits == 1 )
    {
        if ( pString[0] == '0' || pString[0] == 'F' )
        {
            pTruth[0] = (pString[0] == '0') ? 0 : ~(word)0;
            return 0;
        }
        if ( pString[0] == '5' || pString[0] == 'A' )
        {
            pTruth[0] = (pString[0] == '5') ? s_Truths6Neg[0] : s_Truths6[0];
            return 1;
        }
    }
    // determine the number of variables
    nVars = 2 + (nDigits == 1 ? 0 : Abc_Base2Log(nDigits));
    // clean storage
    for ( k = Abc_TtWordNum(nVars) - 1; k >= 0; k-- )
        pTruth[k] = 0;
    // read hexadecimal digits in the reverse order
    // (the last symbol in the string is the least significant digit)
    for ( k = 0; k < nDigits; k++ )
    {
        Digit = Abc_TtReadHexDigit( pString[nDigits - 1 - k] );
        assert( Digit >= 0 && Digit < 16 );
        Abc_TtSetHex( pTruth, k, Digit );
    }
    if ( nVars < 6 )
        pTruth[0] = Abc_Tt6Stretch( pTruth[0], nVars );
    return nVars;
}